

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O1

void (anonymous_namespace)::check<char_const*>(istream *is,char *c)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  char v [1024];
  char local_428 [1032];
  
  lVar3 = 0;
  do {
    std::istream::read((char *)is,(long)(local_428 + lVar3));
    if (local_428[lVar3] == '\0') break;
    iVar1 = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (iVar1 != 0x400);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"zero-terminated string: expected \"",0x22);
  if (c == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1f2f58);
  }
  else {
    sVar2 = strlen(c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,c,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\", got \"",8);
  sVar2 = strlen(local_428);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_428,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  iVar1 = strcmp(c,local_428);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("!strcmp (c, v)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,0x75,"void (anonymous namespace)::check(istream &, const char *)");
}

Assistant:

void
check (istream& is, const char* c)
{
    char v[1024];

    Xdr::read<CharIO> (is, sizeof (v), v);

    cout << "zero-terminated string: "
            "expected \""
         << c
         << "\", "
            "got \""
         << v << "\"" << endl;

    assert (!strcmp (c, v));
}